

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::FullCaseFoldingIterator::next(FullCaseFoldingIterator *this,UnicodeString *full)

{
  int iVar1;
  bool bVar2;
  uint local_48;
  UChar32 c;
  ConstChar16Ptr local_38;
  int local_2c;
  UChar *pUStack_28;
  int32_t length;
  UChar *p;
  UnicodeString *full_local;
  FullCaseFoldingIterator *this_local;
  
  pUStack_28 = this->unfold + this->currentRow * this->unfoldRowWidth;
  if ((this->unfoldRowWidth <= this->rowCpIndex) || (pUStack_28[this->rowCpIndex] == L'\0')) {
    this->currentRow = this->currentRow + 1;
    pUStack_28 = pUStack_28 + this->unfoldRowWidth;
    this->rowCpIndex = this->unfoldStringWidth;
  }
  if (this->currentRow < this->unfoldRows) {
    local_2c = this->unfoldStringWidth;
    while( true ) {
      bVar2 = false;
      if (0 < local_2c) {
        bVar2 = pUStack_28[local_2c + -1] == L'\0';
      }
      if (!bVar2) break;
      local_2c = local_2c + -1;
    }
    p = (UChar *)full;
    full_local = (UnicodeString *)this;
    ConstChar16Ptr::ConstChar16Ptr(&local_38,pUStack_28);
    UnicodeString::setTo(full,'\0',&local_38,local_2c);
    ConstChar16Ptr::~ConstChar16Ptr(&local_38);
    iVar1 = this->rowCpIndex;
    this->rowCpIndex = iVar1 + 1;
    local_48 = (uint)(ushort)pUStack_28[iVar1];
    if ((local_48 & 0xfffffc00) == 0xd800) {
      iVar1 = this->rowCpIndex;
      this->rowCpIndex = iVar1 + 1;
      local_48 = local_48 * 0x400 + (uint)(ushort)pUStack_28[iVar1] + 0xfca02400;
    }
    this_local._4_4_ = local_48;
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

UChar32
FullCaseFoldingIterator::next(UnicodeString &full) {
    // Advance past the last-delivered code point.
    const UChar *p=unfold+(currentRow*unfoldRowWidth);
    if(rowCpIndex>=unfoldRowWidth || p[rowCpIndex]==0) {
        ++currentRow;
        p+=unfoldRowWidth;
        rowCpIndex=unfoldStringWidth;
    }
    if(currentRow>=unfoldRows) { return U_SENTINEL; }
    // Set "full" to the NUL-terminated string in the first unfold column.
    int32_t length=unfoldStringWidth;
    while(length>0 && p[length-1]==0) { --length; }
    full.setTo(FALSE, p, length);
    // Return the code point.
    UChar32 c;
    U16_NEXT_UNSAFE(p, rowCpIndex, c);
    return c;
}